

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listtype.c
# Opt level: O1

LuciObject * list_get_object(LuciObject *list,long index)

{
  int iVar1;
  LuciObject *pLVar2;
  uint uVar3;
  int iVar4;
  
  if ((list == (LuciObject *)0x0) || (list->type != &obj_list_t)) {
    list_get_object_cold_2();
  }
  else {
    if (index < 0) {
      iVar4 = (int)index;
      iVar1 = -iVar4;
      if (iVar4 < 1) {
        iVar1 = iVar4;
      }
      index = (long)(uint)(iVar1 + *(int *)&list[1].field_0x8);
    }
    if ((ulong)index < (ulong)*(uint *)&list[1].field_0x8) {
      pLVar2 = (LuciObject *)(**(code **)(*(long *)(&(list[1].type)->type_name)[index] + 0x10))();
      return pLVar2;
    }
  }
  list_get_object_cold_1();
  if (*(int *)&list[1].field_0x8 != 0) {
    uVar3 = *(int *)&list[1].field_0x8 - 1;
    *(uint *)&list[1].field_0x8 = uVar3;
    pLVar2 = (LuciObject *)(&(list[1].type)->type_name)[uVar3];
    (&(list[1].type)->type_name)[uVar3] = (char *)0x0;
    return pLVar2;
  }
  LuciList_pop_cold_1();
  return (LuciObject *)(&(list[1].type)->type_name)[*(int *)&list[1].field_0x8 - 1];
}

Assistant:

static LuciObject *list_get_object(LuciObject *list, long index)
{
    if (!list || (!ISTYPE(list, obj_list_t))) {
	LUCI_DIE("%s", "Can't iterate over non-list object\n");
    }

    LuciListObj *listobj = (LuciListObj *)list;

    /* convert negative indices to a index starting from list end */
    while (index < 0) {
	index = listobj->count - abs(index);
    }

    if (index >= listobj->count) {
	LUCI_DIE("%s", "List index out of bounds\n");
    }
    LuciObject *item = listobj->items[index];
    return item->type->copy(item);
}